

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O3

void __thiscall RBTS<UF>::PerformLabeling(RBTS<UF> *this)

{
  int *piVar1;
  Mat1b *pMVar2;
  long lVar3;
  Mat1i *pMVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  uint i;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  long local_110;
  long local_108;
  ulong local_100;
  Mat local_b8 [96];
  Scalar_ local_58 [16];
  undefined1 local_48 [16];
  int iVar37;
  
  piVar1 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar1,piVar1[1],4);
  local_48 = (undefined1  [16])0x0;
  local_58[0] = (Scalar_)0x0;
  local_58[1] = (Scalar_)0x0;
  local_58[2] = (Scalar_)0x0;
  local_58[3] = (Scalar_)0x0;
  local_58[4] = (Scalar_)0x0;
  local_58[5] = (Scalar_)0x0;
  local_58[6] = (Scalar_)0x0;
  local_58[7] = (Scalar_)0x0;
  local_58[8] = (Scalar_)0x0;
  local_58[9] = (Scalar_)0x0;
  local_58[10] = (Scalar_)0x0;
  local_58[0xb] = (Scalar_)0x0;
  local_58[0xc] = (Scalar_)0x0;
  local_58[0xd] = (Scalar_)0x0;
  local_58[0xe] = (Scalar_)0x0;
  local_58[0xf] = (Scalar_)0x0;
  cv::Mat::operator=(local_b8,local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar12 = (uint *)operator_new__((ulong)(((*(int *)&pMVar2->field_0xc -
                                            (*(int *)&pMVar2->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar2->field_0x8 -
                                            (*(int *)&pMVar2->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  UF::P_ = puVar12;
  *puVar12 = 0;
  UF::length_ = 1;
  iVar30 = *(int *)&pMVar2->field_0xc;
  uVar18 = *(uint *)&pMVar2->field_0x8;
  uVar22 = 0xffffffffffffffff;
  if (-6 < (long)iVar30) {
    uVar22 = (long)(iVar30 / 2) * 4 + 8;
  }
  pvVar13 = operator_new__(uVar22);
  pvVar14 = operator_new__(uVar22);
  auVar7 = _DAT_00328440;
  auVar6 = _DAT_00328430;
  auVar5 = _DAT_00328420;
  uVar25 = 1;
  if (0 < (int)uVar18) {
    uVar23 = (long)(iVar30 / 2) + 2;
    lVar16 = *(long *)&pMVar2->field_0x10;
    lVar3 = **(long **)&pMVar2->field_0x48;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar28 = *(long *)&pMVar4->field_0x10;
    lVar33 = **(long **)&pMVar4->field_0x48;
    local_108 = lVar28 + 8;
    uVar32 = 0;
    uVar20 = 0;
    uVar22 = 0;
    local_100 = 0;
    uVar21 = 0;
    lVar38 = lVar16;
    local_110 = lVar28;
    do {
      if (0 < iVar30) {
        lVar19 = lVar33 * uVar32 + lVar28;
        lVar15 = lVar19 - lVar33;
        iVar9 = iVar30 * (int)uVar32;
        iVar36 = 0;
        do {
          lVar31 = (long)iVar36;
          iVar37 = iVar36;
          if (*(char *)(lVar3 * uVar32 + lVar16 + lVar31) != '\0') {
            iVar35 = iVar36 + iVar9;
            *(int *)((long)pvVar13 + uVar20 * 4) = iVar35;
            uVar20 = (uVar20 + 1) % uVar23;
            iVar44 = iVar36;
            iVar37 = iVar36 + 1;
            if (iVar36 + 1 < iVar30) {
              iVar37 = iVar30;
            }
            do {
              lVar31 = lVar31 + 1;
              iVar10 = iVar37;
              if (iVar30 <= lVar31) break;
              iVar10 = iVar44 + 1;
              iVar44 = iVar10;
            } while (*(char *)(lVar38 + lVar31) != '\0');
            iVar37 = iVar10 + -1;
            iVar29 = iVar37 + iVar9;
            *(int *)((long)pvVar14 + local_100 * 4) = iVar29;
            uVar25 = UF::length_;
            local_100 = (local_100 + 1) % uVar23;
            iVar44 = *(int *)((long)pvVar14 + uVar22 * 4);
            while (iVar44 < (int)((iVar35 - iVar30) - (uint)(iVar36 != 0))) {
              uVar21 = (uVar21 + 1) % uVar23;
              uVar22 = (uVar22 + 1) % uVar23;
              iVar44 = *(int *)((long)pvVar14 + uVar22 * 4);
            }
            iVar34 = *(int *)((long)pvVar13 + uVar21 * 4);
            iVar29 = iVar29 - iVar30;
            iVar10 = (uint)(iVar10 != iVar30) + iVar29;
            if (iVar10 < iVar34) {
              puVar12[UF::length_] = UF::length_;
              UF::length_ = UF::length_ + 1;
              uVar17 = (uint)((long)iVar35 % (long)iVar30);
              uVar11 = (iVar37 - iVar36) + uVar17 + 1;
              if (uVar17 < uVar11) {
                uVar27 = (long)iVar35 % (long)iVar30 & 0xffffffff;
                lVar26 = uVar11 - uVar27;
                lVar31 = lVar26 + -1;
                auVar41._8_4_ = (int)lVar31;
                auVar41._0_8_ = lVar31;
                auVar41._12_4_ = (int)((ulong)lVar31 >> 0x20);
                lVar31 = local_110 + uVar27 * 4;
                auVar41 = auVar41 ^ auVar7;
                uVar27 = 0;
                do {
                  auVar45._8_4_ = (int)uVar27;
                  auVar45._0_8_ = uVar27;
                  auVar45._12_4_ = (int)(uVar27 >> 0x20);
                  auVar43 = (auVar45 | auVar6) ^ auVar7;
                  iVar36 = auVar41._4_4_;
                  if ((bool)(~(iVar36 < auVar43._4_4_ ||
                              auVar41._0_4_ < auVar43._0_4_ && auVar43._4_4_ == iVar36) & 1)) {
                    *(uint *)(lVar31 + uVar27 * 4) = uVar25;
                  }
                  if (auVar43._12_4_ <= auVar41._12_4_ &&
                      (auVar43._8_4_ <= auVar41._8_4_ || auVar43._12_4_ != auVar41._12_4_)) {
                    *(uint *)(lVar31 + 4 + uVar27 * 4) = uVar25;
                  }
                  auVar43 = (auVar45 | auVar5) ^ auVar7;
                  iVar44 = auVar43._4_4_;
                  if (iVar44 <= iVar36 && (iVar44 != iVar36 || auVar43._0_4_ <= auVar41._0_4_)) {
                    *(uint *)(lVar31 + 8 + uVar27 * 4) = uVar25;
                    *(uint *)(lVar31 + 0xc + uVar27 * 4) = uVar25;
                  }
                  uVar27 = uVar27 + 4;
                } while ((lVar26 + 3U & 0xfffffffffffffffc) != uVar27);
              }
            }
            else {
              uVar25 = *(uint *)(lVar15 + (long)(iVar34 % iVar30) * 4);
              uVar17 = (uint)((long)iVar35 % (long)iVar30);
              uVar11 = (iVar37 - iVar36) + uVar17 + 1;
              if (uVar17 < uVar11) {
                uVar27 = (long)iVar35 % (long)iVar30 & 0xffffffff;
                lVar26 = uVar11 - uVar27;
                lVar31 = lVar26 + -1;
                auVar43._8_4_ = (int)lVar31;
                auVar43._0_8_ = lVar31;
                auVar43._12_4_ = (int)((ulong)lVar31 >> 0x20);
                lVar31 = local_108 + uVar27 * 4;
                uVar27 = 0;
                do {
                  auVar42._8_4_ = (int)uVar27;
                  auVar42._0_8_ = uVar27;
                  auVar42._12_4_ = (int)(uVar27 >> 0x20);
                  auVar41 = auVar43 ^ auVar7;
                  auVar45 = (auVar42 | auVar6) ^ auVar7;
                  iVar36 = auVar41._4_4_;
                  if ((bool)(~(iVar36 < auVar45._4_4_ ||
                              auVar41._0_4_ < auVar45._0_4_ && auVar45._4_4_ == iVar36) & 1)) {
                    *(uint *)(lVar31 + -8 + uVar27 * 4) = uVar25;
                  }
                  if (auVar45._12_4_ <= auVar41._12_4_ &&
                      (auVar45._8_4_ <= auVar41._8_4_ || auVar45._12_4_ != auVar41._12_4_)) {
                    *(uint *)(lVar31 + -4 + uVar27 * 4) = uVar25;
                  }
                  auVar42 = (auVar42 | auVar5) ^ auVar7;
                  iVar35 = auVar42._4_4_;
                  if (iVar35 <= iVar36 && (iVar35 != iVar36 || auVar42._0_4_ <= auVar41._0_4_)) {
                    *(uint *)(lVar31 + uVar27 * 4) = uVar25;
                    *(uint *)(lVar31 + 4 + uVar27 * 4) = uVar25;
                  }
                  uVar27 = uVar27 + 4;
                } while ((lVar26 + 3U & 0xfffffffffffffffc) != uVar27);
              }
              iVar36 = iVar44;
              if (iVar44 <= iVar29) {
                bVar39 = false;
                do {
                  if (bVar39) {
                    uVar11 = *(uint *)(lVar15 + (long)(iVar34 % iVar30) * 4);
                    do {
                      uVar24 = uVar11;
                      uVar11 = puVar12[uVar24];
                      uVar8 = uVar25;
                    } while (puVar12[uVar24] < uVar24);
                    do {
                      uVar11 = uVar8;
                      uVar8 = puVar12[uVar11];
                    } while (puVar12[uVar11] < uVar11);
                    if (uVar24 < uVar11) {
                      puVar12[uVar11] = uVar24;
                    }
                    else {
                      puVar12[uVar24] = uVar11;
                    }
                  }
                  uVar21 = (uVar21 + 1) % uVar23;
                  iVar34 = *(int *)((long)pvVar13 + uVar21 * 4);
                  uVar22 = (uVar22 + 1) % uVar23;
                  iVar36 = *(int *)((long)pvVar14 + uVar22 * 4);
                  bVar39 = true;
                } while (iVar36 <= iVar29);
              }
              if (iVar29 < iVar36) {
                if (iVar10 < iVar34) goto LAB_001b71e8;
                bVar40 = SBORROW4(iVar44,iVar29);
                iVar36 = iVar44 - iVar29;
                bVar39 = iVar44 == iVar29;
              }
              else {
                do {
                  uVar21 = (uVar21 + 1) % uVar23;
                  uVar22 = (uVar22 + 1) % uVar23;
                } while (*(int *)((long)pvVar14 + uVar22 * 4) <= iVar29);
                iVar34 = *(int *)((long)pvVar13 + uVar21 * 4);
                bVar40 = SBORROW4(iVar34,iVar10);
                iVar36 = iVar34 - iVar10;
                bVar39 = iVar34 == iVar10;
              }
              if (bVar39 || bVar40 != iVar36 < 0) {
                uVar25 = *(uint *)(lVar19 + (long)(int)uVar17 * 4);
                do {
                  uVar17 = uVar25;
                  uVar25 = puVar12[uVar17];
                  uVar11 = *(uint *)(lVar15 + (long)(iVar34 % iVar30) * 4);
                } while (puVar12[uVar17] < uVar17);
                do {
                  uVar25 = uVar11;
                  uVar11 = puVar12[uVar25];
                } while (puVar12[uVar25] < uVar25);
                if (uVar17 < uVar25) {
                  puVar12[uVar25] = uVar17;
                }
                else {
                  puVar12[uVar17] = uVar25;
                }
              }
            }
          }
LAB_001b71e8:
          iVar36 = iVar37 + 1;
        } while (iVar36 < iVar30);
      }
      uVar32 = uVar32 + 1;
      lVar38 = lVar38 + lVar3;
      local_108 = local_108 + lVar33;
      local_110 = local_110 + lVar33;
    } while (uVar32 != uVar18);
    uVar22 = (ulong)UF::length_;
    uVar25 = 1;
    if (1 < uVar22) {
      uVar25 = 1;
      uVar20 = 1;
      do {
        if (puVar12[uVar20] < uVar20) {
          uVar18 = puVar12[puVar12[uVar20]];
        }
        else {
          uVar18 = uVar25;
          uVar25 = uVar25 + 1;
        }
        puVar12[uVar20] = uVar18;
        uVar20 = uVar20 + 1;
      } while (uVar22 != uVar20);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar25;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar30 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar30) {
    lVar16 = *(long *)&pMVar4->field_0x10;
    lVar3 = **(long **)&pMVar4->field_0x48;
    lVar28 = 0;
    do {
      iVar9 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar9 != 0) {
        lVar33 = 0;
        do {
          *(uint *)(lVar16 + lVar33) = puVar12[*(uint *)(lVar16 + lVar33)];
          lVar33 = lVar33 + 4;
        } while ((long)iVar9 * 4 != lVar33);
        iVar30 = *(int *)&pMVar4->field_0x8;
      }
      lVar28 = lVar28 + 1;
      lVar16 = lVar16 + lVar3;
    } while (lVar28 < iVar30);
  }
  operator_delete__(puVar12);
  operator_delete__(pvVar14);
  operator_delete__(pvVar13);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }